

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::rc::Texture2DArray::sample4
          (Texture2DArray *this,Vec4 *output,Vec3 *packetTexcoords,float lodBias)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int i;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  ulong uVar8;
  bool bVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Vec3 dFdy1;
  Vec3 dFdy0;
  Vec3 dFdx1;
  Vec3 dFdx0;
  float local_9c;
  float local_98;
  float local_80 [4];
  float local_70 [4];
  float local_60 [4];
  float local_50 [4];
  Texture2DArrayView local_40;
  
  local_98 = 0.0;
  local_9c = 0.0;
  if (0 < (this->m_view).m_numLevels) {
    local_9c = (float)(((this->m_view).m_levels)->m_size).m_data[0];
    local_98 = (float)(((this->m_view).m_levels)->m_size).m_data[1];
  }
  local_50[2] = 0.0;
  local_50[0] = 0.0;
  local_50[1] = 0.0;
  lVar5 = 0;
  do {
    local_50[lVar5] = packetTexcoords[1].m_data[lVar5] - packetTexcoords->m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_60[2] = 0.0;
  local_60[0] = 0.0;
  local_60[1] = 0.0;
  lVar5 = 0;
  do {
    local_60[lVar5] = packetTexcoords[3].m_data[lVar5] - packetTexcoords[2].m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_70[2] = 0.0;
  local_70[0] = 0.0;
  local_70[1] = 0.0;
  lVar5 = 0;
  do {
    local_70[lVar5] = packetTexcoords[2].m_data[lVar5] - packetTexcoords->m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_80[2] = 0.0;
  local_80[0] = 0.0;
  local_80[1] = 0.0;
  lVar5 = 0;
  do {
    local_80[lVar5] = packetTexcoords[3].m_data[lVar5] - packetTexcoords[1].m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  fVar4 = local_50[0];
  fVar3 = local_60[0];
  fVar2 = local_70[0];
  fVar1 = local_80[0];
  pfVar7 = packetTexcoords->m_data + 2;
  uVar8 = 0;
  do {
    fVar11 = fVar4;
    if (1 < uVar8) {
      fVar11 = fVar3;
    }
    pfVar6 = local_60;
    if (1 >= uVar8) {
      pfVar6 = local_50;
    }
    bVar9 = (uVar8 & 1) != 0;
    fVar15 = fVar2;
    if (bVar9) {
      fVar15 = fVar1;
    }
    fVar12 = -fVar11;
    if (-fVar11 <= fVar11) {
      fVar12 = fVar11;
    }
    fVar11 = -fVar15;
    if (-fVar15 <= fVar15) {
      fVar11 = fVar15;
    }
    fVar15 = pfVar6[1];
    fVar13 = -fVar15;
    if (-fVar15 <= fVar15) {
      fVar13 = fVar15;
    }
    pfVar6 = local_80;
    if (!bVar9) {
      pfVar6 = local_70;
    }
    fVar15 = pfVar6[1];
    fVar14 = -fVar15;
    if (-fVar15 <= fVar15) {
      fVar14 = fVar15;
    }
    fVar11 = (float)(~-(uint)(fVar11 <= fVar12) & (uint)fVar11 |
                    (uint)fVar12 & -(uint)(fVar11 <= fVar12)) * local_9c;
    fVar15 = (float)(~-(uint)(fVar14 <= fVar13) & (uint)fVar14 |
                    (uint)fVar13 & -(uint)(fVar14 <= fVar13)) * local_98;
    uVar10 = -(uint)(fVar15 <= fVar11);
    fVar11 = logf((float)(~uVar10 & (uint)fVar15 | (uint)fVar11 & uVar10));
    tcu::Texture2DArrayView::sample
              (&local_40,(Sampler *)&this->m_view,((Vec3 *)(pfVar7 + -2))->m_data[0],pfVar7[-1],
               *pfVar7,fVar11 * 1.442695 + lodBias);
    output->m_data[0] = (float)local_40.m_numLevels;
    output->m_data[1] = (float)local_40._4_4_;
    *(ConstPixelBufferAccess **)(output->m_data + 2) = local_40.m_levels;
    uVar8 = uVar8 + 1;
    output = output + 1;
    pfVar7 = pfVar7 + 3;
  } while (uVar8 != 4);
  return;
}

Assistant:

void Texture2DArray::sample4 (tcu::Vec4 output[4], const tcu::Vec3 packetTexcoords[4], float lodBias) const
{
	const float texWidth  = (float)m_view.getWidth();
	const float texHeight = (float)m_view.getHeight();

	const tcu::Vec3 dFdx0 = packetTexcoords[1] - packetTexcoords[0];
	const tcu::Vec3 dFdx1 = packetTexcoords[3] - packetTexcoords[2];
	const tcu::Vec3 dFdy0 = packetTexcoords[2] - packetTexcoords[0];
	const tcu::Vec3 dFdy1 = packetTexcoords[3] - packetTexcoords[1];

	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec3& dFdx = (fragNdx & 2) ? dFdx1 : dFdx0;
		const tcu::Vec3& dFdy = (fragNdx & 1) ? dFdy1 : dFdy0;

		const float mu = de::max(de::abs(dFdx.x()), de::abs(dFdy.x()));
		const float mv = de::max(de::abs(dFdx.y()), de::abs(dFdy.y()));
		const float p = de::max(mu * texWidth, mv * texHeight);

		const float	lod = deFloatLog2(p) + lodBias;

		output[fragNdx] = sample(packetTexcoords[fragNdx].x(), packetTexcoords[fragNdx].y(), packetTexcoords[fragNdx].z(), lod);
	}
}